

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O0

bool __thiscall sjtu::timeType::operator<(timeType *this,timeType *other)

{
  int i_1;
  int i;
  int tmp2;
  int tmp1;
  timeType *other_local;
  timeType *this_local;
  
  tmp1 = 0;
  tmp2 = 0;
  for (i = 1; i <= this->month; i = i + 1) {
    tmp1 = *(int *)(months + (long)i * 4) + tmp1;
  }
  for (i_1 = 1; i_1 <= other->month; i_1 = i_1 + 1) {
    tmp2 = *(int *)(months + (long)i_1 * 4) + tmp2;
  }
  return this->minute + (this->hour + (this->day + tmp1) * 0x18) * 0x3c <
         other->minute + (other->hour + (other->day + tmp2) * 0x18) * 0x3c;
}

Assistant:

bool timeType::operator<(const timeType &other) const {
            int tmp1 = 0, tmp2 = 0;
            for (int i = 1; i <= month; ++i)
                tmp1 += months[i];
            tmp1 += day;
            tmp1 *= 24;
            tmp1 += hour;
            tmp1 *= 60;
            tmp1 += minute;
            for (int i = 1; i <= other.month; ++i)
                tmp2 += other.months[i];
            tmp2 += other.day;
            tmp2 *= 24;
            tmp2 += other.hour;
            tmp2 *= 60;
            tmp2 += other.minute;
            return (tmp1 < tmp2);
        }